

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SliceBase.h
# Opt level: O0

uint8_t * __thiscall
arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::getBinary
          (SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *this,
          ValueLength *length)

{
  bool bVar1;
  byte bVar2;
  char *msg;
  unsigned_long uVar3;
  uint8_t *puVar4;
  unsigned_long *in_RSI;
  uint8_t *in_RDI;
  uint8_t h;
  ValueLength in_stack_ffffffffffffffd0;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe7;
  
  bVar1 = isBinary((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)0x11f0cd);
  if (!bVar1) {
    msg = (char *)__cxa_allocate_exception(0x18);
    Exception::Exception
              ((Exception *)CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0),
               (ExceptionType)((ulong)in_RDI >> 0x20),msg);
    __cxa_throw(msg,&Exception::typeinfo,Exception::~Exception);
  }
  bVar2 = head((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)0x11f116);
  start((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)0x11f124);
  uVar3 = readIntegerNonEmpty<unsigned_long>(in_RDI,in_stack_ffffffffffffffd0);
  *in_RSI = uVar3;
  puVar4 = start((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)0x11f15f);
  return puVar4 + (long)(int)(uint)bVar2 + -0xbe;
}

Assistant:

uint8_t const* getBinary(ValueLength& length) const {
    if (!isBinary()) {
      throw Exception(Exception::InvalidValueType, "Expecting type Binary");
    }

    uint8_t const h = head();
    VELOCYPACK_ASSERT(h >= 0xc0 && h <= 0xc7);

    length = readIntegerNonEmpty<ValueLength>(start() + 1, h - 0xbf);
    checkOverflow(length);
    return start() + 1 + h - 0xbf;
  }